

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::RunTest(cmCTest *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *argv,string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  string *file1;
  pointer pbVar2;
  char *pcVar3;
  pointer this_00;
  cmCTest *this_01;
  __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  this_02;
  int *piVar4;
  undefined8 uVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ostream *poVar11;
  string *file2;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> this_03;
  cmUVProcessChainBuilder *this_04;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  cmUVStreamReadHandle *pcVar12;
  ulong uVar13;
  pointer pbVar14;
  Status *this_05;
  SaveRestoreEnvironment *this_06;
  uint uVar15;
  size_t __n;
  undefined4 uVar16;
  undefined8 unaff_R14;
  pointer __p;
  cmDuration cVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  cmProcessOutput processOutput;
  vector<char,_std::allocator<char>_> tempOutput;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  cmUVProcessChain chain;
  _Any_data __tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  cmCTest inst;
  uv_pipe_ptr outputStream;
  ostringstream cmCTestLog_msg;
  cmUVProcessChainBuilder builder;
  cmProcessOutput local_449;
  string *local_448;
  cmDuration local_440;
  vector<char,_std::allocator<char>_> local_438;
  cmUVStreamReadHandle *local_418;
  undefined1 local_410 [16];
  StdioConfiguration SStack_400;
  pointer local_3f8;
  pointer local_3f0 [3];
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  cmCTest *local_3b0;
  __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_3a8;
  cmCTest local_3a0 [2];
  long local_390 [2];
  int *local_380;
  undefined1 local_378 [24];
  pointer pbStack_360;
  long local_358;
  uv_handle_ptr_base_<uv_pipe_s> local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_330;
  undefined1 local_328 [8];
  StdioConfiguration SStack_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  pointer pPStack_310;
  StdioConfiguration local_308;
  undefined8 local_300;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_190;
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [3];
  ios_base local_138 [264];
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R14 >> 8),
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start !=
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_448 = output;
  local_3b0 = (cmCTest *)testTimeOut.__r;
  local_378._0_8_ = log;
  local_330 = environment;
  cVar17 = cmCTestScriptHandler::GetRemainingTimeAllowed
                     (&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                       ScriptHandler);
  local_440.__r =
       (rep_conflict)
       (~-(ulong)(cVar17.__r != 10000000.0) & (ulong)cVar17.__r |
       (ulong)(cVar17.__r + -120.0) & -(ulong)(cVar17.__r != 10000000.0));
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  cVar17.__r = ((_Var1._M_head_impl)->TimeOut).__r;
  if ((0.0 < cVar17.__r) && (cVar17.__r < local_440.__r)) {
    local_440.__r = ((_Var1._M_head_impl)->TimeOut).__r;
  }
  if ((0.0 < (double)local_3b0) &&
     (cVar17 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var1._M_head_impl)->ScriptHandler),
     (double)local_3b0 < cVar17.__r)) {
    local_440.__r = (rep_conflict)local_3b0;
  }
  if (local_440.__r <= 0.0) {
    local_440.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,"Test timeout computed to be: ",0x1d);
  if ((local_440.__r != 10000000.0) || (NAN(local_440.__r))) {
    uVar10 = cmDurationTo<unsigned_int>(&local_440);
    cVar7 = '\x01';
    if (9 < uVar10) {
      uVar15 = uVar10;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar15 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_001a171e;
        }
        if (uVar15 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_001a171e;
        }
        if (uVar15 < 10000) goto LAB_001a171e;
        bVar8 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar8);
      cVar7 = cVar7 + '\x01';
    }
LAB_001a171e:
    local_1a8._0_8_ = (long)local_1a8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_1a8,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8._0_8_,local_1a8._8_4_,uVar10);
  }
  else {
    local_1a8._0_8_ = (long)local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"infinite","");
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,(char *)local_1a8._0_8_,
                       CONCAT44(local_1a8._12_4_,local_1a8._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x4cd,(char *)local_1a8._0_8_,false);
  if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  file1 = (argv->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar8 = cmsys::SystemTools::SameFile(file1,file2);
  local_380 = retVal;
  if ((bVar8) &&
     (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess == false
     )) {
    cmCTest(local_3a0);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)local_3a0[0].Impl._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8));
    ((cmDuration *)
    ((long)local_3a0[0].Impl._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3aa0))->__r =
         local_440.__r;
    local_3b0 = this;
    local_378._12_4_ = uVar16;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    *(ostringstream **)
     ((long)local_3a0[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b48) =
         (ostringstream *)local_328;
    *(ostringstream **)
     ((long)local_3a0[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b50) =
         (ostringstream *)local_328;
    local_3d8._0_8_ = (pointer)0x0;
    local_3d8._8_8_ = 0;
    local_3c8._0_8_ = 0;
    pbVar14 = (argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (argv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar14 != pbVar2) {
      do {
        iVar9 = std::__cxx11::string::compare((char *)pbVar14);
        if ((iVar9 == 0) &&
           (((local_440.__r != 10000000.0 || (NAN(local_440.__r))) && (0.0 < local_440.__r)))) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[15]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3d8,
                     (char (*) [15])"--test-timeout");
          uVar10 = cmDurationTo<unsigned_int>(&local_440);
          cVar7 = '\x01';
          if (9 < uVar10) {
            uVar15 = uVar10;
            cVar6 = '\x04';
            do {
              cVar7 = cVar6;
              if (uVar15 < 100) {
                cVar7 = cVar7 + -2;
                goto LAB_001a2094;
              }
              if (uVar15 < 1000) {
                cVar7 = cVar7 + -1;
                goto LAB_001a2094;
              }
              if (uVar15 < 10000) goto LAB_001a2094;
              bVar8 = 99999 < uVar15;
              uVar15 = uVar15 / 10000;
              cVar6 = cVar7 + '\x04';
            } while (bVar8);
            cVar7 = cVar7 + '\x01';
          }
LAB_001a2094:
          local_1a8._0_8_ = (long)local_1a8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_1a8,cVar7);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_1a8._0_8_,local_1a8._8_4_,uVar10);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
          ;
          if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3d8,
                   pbVar14);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar2);
    }
    uVar5 = local_378._0_8_;
    if ((pointer)local_378._0_8_ != (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_378._0_8_,"* Run internal CTest",0x14);
      cVar7 = (char)uVar5;
      std::ios::widen((char)*(_func_int **)((long)((_Alloc_hider *)uVar5)->_M_p + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    piVar4 = local_380;
    this_01 = local_3b0;
    local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (local_378[0xc] != '\0') {
      this_06 = (SaveRestoreEnvironment *)operator_new(0x18);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(this_06);
      this_00 = local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_1a8._0_4_ = None;
      local_1a8._4_4_ = 0;
      bVar8 = (SaveRestoreEnvironment *)
              local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (SaveRestoreEnvironment *)0x0;
      local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)this_06;
      if (bVar8) {
        cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
                  ((SaveRestoreEnvironment *)this_00);
        operator_delete(this_00,0x18);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)local_1a8);
      cmSystemTools::AppendEnv(local_330);
    }
    iVar9 = Run(local_3a0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3d8,local_448);
    *piVar4 = iVar9;
    if (local_448 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_448,local_1a8._0_8_);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    if (local_448 != (string *)0x0 && (pointer)local_378._0_8_ != (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_378._0_8_,(local_448->_M_dataplus)._M_p,
                 local_448->_M_string_length);
    }
    if (local_448 != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Internal cmCTest object used to run test.",0x29);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      poVar11 = (ostream *)std::ostream::flush();
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(local_448->_M_dataplus)._M_p,local_448->_M_string_length);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this_01,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4f9,(char *)local_410._8_8_,false);
      if ((pointer *)local_410._8_8_ != &local_3f8) {
        operator_delete((void *)local_410._8_8_,
                        (ulong)((long)&(local_3f8->Arguments).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&local_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::~unique_ptr
              (&local_3a0[0].Impl);
    bVar8 = true;
  }
  else {
    local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_448 != (string *)0x0) {
      local_448->_M_string_length = 0;
      *(local_448->_M_dataplus)._M_p = '\0';
    }
    local_3a8._M_t.
    super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
         (tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
          )(_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )0x0;
    if ((char)uVar16 != '\0') {
      this_03._M_head_impl = (SaveRestoreEnvironment *)operator_new(0x18);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(this_03._M_head_impl);
      this_02._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           local_3a8._M_t.
           super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
           .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl;
      local_328 = (undefined1  [8])0x0;
      bVar8 = local_3a8._M_t.
              super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
               )0x0;
      local_3a8._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           (tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )(tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )this_03._M_head_impl;
      if (bVar8) {
        cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
                  ((SaveRestoreEnvironment *)
                   this_02._M_t.
                   super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>.
                   _M_head_impl);
        operator_delete((void *)this_02._M_t.
                                super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                .
                                super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>
                                ._M_head_impl,0x18);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)local_328);
      cmSystemTools::AppendEnv(local_330);
    }
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_1a8);
    this_04 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_1a8,argv);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_04);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Command is: ",0xc);
    pbVar14 = (argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length)
    ;
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x50b,(char *)local_410._8_8_,false);
    if ((pointer *)local_410._8_8_ != &local_3f8) {
      operator_delete((void *)local_410._8_8_,
                      (ulong)((long)&(local_3f8->Arguments).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_410);
    cmProcessOutput::cmProcessOutput(&local_449,encoding,0x400);
    local_348.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_348.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_410);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_348,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_<uv_pipe_s> *)&local_348);
    iVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_410);
    uv_pipe_open(handle,iVar9);
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_348);
    pcVar12 = (cmUVStreamReadHandle *)operator_new(0x58);
    *(undefined8 *)((long)&(pcVar12->OnFinish).super__Function_base._M_functor + 8) = 0;
    (pcVar12->OnFinish).super__Function_base._M_manager = (_Manager_type)0x0;
    (pcVar12->OnRead)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pcVar12->OnFinish).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pcVar12->OnRead).super__Function_base._M_functor + 8) = 0;
    (pcVar12->OnRead).super__Function_base._M_manager = (_Manager_type)0x0;
    (pcVar12->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pcVar12->OnRead).super__Function_base._M_functor = 0;
    (pcVar12->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pcVar12->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pcVar12->OnFinish)._M_invoker = (_Invoker_type)0x0;
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pPStack_310 = (pointer)0x0;
    local_328 = (undefined1  [8])0x0;
    SStack_320.Type = None;
    SStack_320.FileDescriptor = 0;
    local_418 = pcVar12;
    local_410._8_8_ = operator_new(0x28);
    *(cmCTest **)local_410._8_8_ = this;
    *(cmProcessOutput **)(local_410._8_8_ + 8) = &local_449;
    *(string ***)(local_410._8_8_ + 0x10) = &local_448;
    *(vector<char,_std::allocator<char>_> **)(local_410._8_8_ + 0x18) = &local_438;
    *(pointer *)(local_410._8_8_ + 0x20) = (pointer)local_378;
    SStack_400 = SStack_320;
    local_328 = *(undefined1 (*) [8])&(pcVar12->OnRead).super__Function_base._M_functor;
    pcVar3 = *(char **)((long)&(pcVar12->OnRead).super__Function_base._M_functor + 8);
    *(undefined8 *)&(pcVar12->OnRead).super__Function_base._M_functor = local_410._8_8_;
    *(StdioConfiguration *)((long)&(pcVar12->OnRead).super__Function_base._M_functor + 8) =
         SStack_320;
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pcVar12->OnRead).super__Function_base._M_manager;
    (pcVar12->OnRead).super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_manager;
    pPStack_310 = (pointer)(pcVar12->OnRead)._M_invoker;
    (pcVar12->OnRead)._M_invoker =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_invoke;
    if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      SStack_320 = (StdioConfiguration)pcVar3;
      (*(code *)local_318)(local_328,local_328,3);
    }
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pPStack_310 = (pointer)0x0;
    local_328 = (undefined1  [8])0x0;
    SStack_320.Type = None;
    SStack_320.FileDescriptor = 0;
    local_410._8_8_ = operator_new(0x18);
    *(cmCTest **)local_410._8_8_ = this;
    *(cmProcessOutput **)(local_410._8_8_ + 8) = &local_449;
    *(pointer *)(local_410._8_8_ + 0x10) = (pointer)local_378;
    SStack_400 = SStack_320;
    local_328 = *(undefined1 (*) [8])&(pcVar12->OnFinish).super__Function_base._M_functor;
    pcVar3 = *(char **)((long)&(pcVar12->OnFinish).super__Function_base._M_functor + 8);
    *(undefined8 *)&(pcVar12->OnFinish).super__Function_base._M_functor = local_410._8_8_;
    *(StdioConfiguration *)((long)&(pcVar12->OnFinish).super__Function_base._M_functor + 8) =
         SStack_320;
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pcVar12->OnFinish).super__Function_base._M_manager;
    (pcVar12->OnFinish).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_manager;
    pPStack_310 = (pointer)(pcVar12->OnFinish)._M_invoker;
    (pcVar12->OnFinish)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_invoke;
    SStack_320 = (StdioConfiguration)pcVar3;
    if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)local_318)(local_328,local_328,3);
    }
    stream->data = pcVar12;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar13 = (ulong)(local_440.__r * 1000.0);
    bVar8 = cmUVProcessChain::Wait
                      ((cmUVProcessChain *)local_410,
                       (long)(local_440.__r * 1000.0 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f
                       | uVar13);
    local_378._16_8_ = (pointer)0x0;
    pbStack_360 = (pointer)0x0;
    local_358 = 0;
    uVar13 = (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar13 == 0) {
      pbVar14 = (pointer)0x0;
    }
    else {
      if ((long)uVar13 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar14 = (pointer)operator_new(uVar13);
    }
    local_358 = (long)pbVar14 + uVar13;
    __n = (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_378._16_8_ = pbVar14;
    if (__n != 0) {
      pbStack_360 = pbVar14;
      memmove(pbVar14,local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
    }
    pbStack_360 = (pointer)((long)pbVar14 + __n);
    cmProcessOutput::DecodeText
              (&local_449,(vector<char,_std::allocator<char>_> *)(local_378 + 0x10),&local_438,0);
    if ((pointer)local_378._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_378._16_8_,local_358 - local_378._16_8_);
    }
    if ((local_448 != (string *)0x0) &&
       (local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      std::__cxx11::string::append
                ((char *)local_448,
                 (ulong)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"-- Process completed",0x14);
    std::ios::widen((char)(ostream *)local_328 +
                    (char)(((SaveRestoreEnvironment *)((long)local_328 + -0x18))->Env).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    std::ostream::put((char)local_328);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x533,(char *)local_410._8_8_,false);
    if ((pointer *)local_410._8_8_ != &local_3f8) {
      operator_delete((void *)local_410._8_8_,
                      (ulong)((long)&(local_3f8->Arguments).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    if (bVar8) {
      this_05 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_410,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_410 + 8),this_05);
      if (local_410._8_4_ == None) {
        iVar9 = (int)this_05->ExitStatus;
        *local_380 = iVar9;
        bVar8 = true;
        if ((iVar9 != 0) &&
           (((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&local_438);
        }
      }
      else {
        if (local_410._8_4_ == 5) {
          local_328 = (undefined1  [8])0x16;
          SStack_320 = (StdioConfiguration)0x892459;
          local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pPStack_310 = local_3f8;
          local_308 = SStack_400;
          local_300 = 0;
          views._M_len = 2;
          views._M_array = (iterator)local_328;
          cmCatViews((string *)local_3d8,views);
          if (local_448 != (string *)0x0) {
            std::__cxx11::string::_M_append((char *)local_448,local_3d8._0_8_);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_328,(char *)local_3d8._0_8_,local_3d8._8_8_);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x548,(char *)local_3a0[0].Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        else {
          if (((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
              OutputTestOutputOnTestFailure == true) {
            OutputTestErrors(this,&local_438);
          }
          *local_380 = this_05->TermSignal;
          local_328 = (undefined1  [8])0x1a;
          SStack_320 = (StdioConfiguration)0x89253f;
          local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pPStack_310 = local_3f8;
          local_308 = SStack_400;
          local_300 = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_328;
          cmCatViews((string *)local_3d8,views_00);
          if (local_448 != (string *)0x0) {
            std::__cxx11::string::_M_append((char *)local_448,local_3d8._0_8_);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_328,(char *)local_3d8._0_8_,local_3d8._8_8_);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x554,(char *)local_3a0[0].Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        if (local_3a0[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
            (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_390) {
          operator_delete((void *)local_3a0[0].Impl._M_t.
                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                          local_390[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._0_8_ != &local_3c8) {
          operator_delete((void *)local_3d8._0_8_,local_3c8._0_8_ + 1);
        }
        bVar8 = false;
      }
      if (SStack_400 != (StdioConfiguration)local_3f0) {
        operator_delete((void *)SStack_400,
                        (ulong)((long)&(local_3f0[0]->Arguments).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    else {
      bVar8 = false;
    }
    if (local_418 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_418,local_418);
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_348);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != local_168) {
      operator_delete(local_178._M_p,local_168[0]._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_190);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&local_3a8);
    if (local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_438.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar8;
}

Assistant:

bool cmCTest::RunTest(const std::vector<std::string>& argv,
                      std::string* output, int* retVal, std::ostream* log,
                      cmDuration testTimeOut,
                      std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (auto const& i : argv) {
      // make sure we pass the timeout in for any build and test
      // invocations. Since --build-generator is required this is a
      // good place to check for it, and to add the arguments in
      if (i == "--build-generator" && timeout != cmCTest::MaxDuration() &&
          timeout > cmDuration::zero()) {
        args.emplace_back("--test-timeout");
        args.push_back(std::to_string(cmDurationTo<unsigned int>(timeout)));
      }
      args.emplace_back(i);
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return true;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmUVProcessChainBuilder builder;
  builder.AddCommand(argv).SetMergedBuiltinStreams();
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  auto chain = builder.Start();

  cmProcessOutput processOutput(encoding);
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tempOutput,
     &log](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      if (output) {
        cm::append(tempOutput, data.data(), data.data() + data.size());
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (log) {
        log->write(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &log]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (log) {
          log->write(strdata.c_str(), strdata.size());
        }
      }
    });

  bool complete = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  bool result = false;

  if (complete) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        result = true;
        break;
      case cmUVProcessChain::ExceptionCode::Spawn: {
        std::string outerr =
          cmStrCat("\n*** ERROR executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
      default: {
        if (this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        *retVal = status.TermSignal;
        std::string outerr =
          cmStrCat("\n*** Exception executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
    }
  }

  return result;
}